

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-batchverify.h
# Opt level: O3

int ed25519_sign_open_batch(uchar **m,size_t *mlen,uchar **pk,uchar **RS,size_t num,int *valid)

{
  uchar **ppuVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  heap_index_t temp;
  ulong uVar6;
  heap_index_t hVar7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  heap_index_t hVar14;
  size_t sVar15;
  size_t sVar16;
  bignum256modm *out;
  bignum256modm *pabVar17;
  heap_index_t hVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  batch_heap *buf;
  heap_index_t hVar26;
  bignum256modm_element_t bVar27;
  bignum256modm *pabVar28;
  ge25519 *pgVar29;
  uint uVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  uchar point_buffer [3] [32];
  ge25519 p;
  uchar hram [64];
  batch_heap batch;
  size_t local_72b0;
  uchar **local_72a0;
  long local_7258;
  long local_7250;
  long local_7248;
  long local_7240;
  char local_7238 [8];
  char acStack_7230 [8];
  char local_7228 [4];
  char cStack_7224;
  char cStack_7223;
  char cStack_7222;
  uchar uStack_7221;
  char cStack_7220;
  char cStack_721f;
  char cStack_721e;
  char cStack_721d;
  char cStack_721c;
  char cStack_721b;
  char cStack_721a;
  uchar uStack_7219;
  char local_7218 [8];
  char acStack_7210 [8];
  char local_7208 [4];
  char cStack_7204;
  char cStack_7203;
  char cStack_7202;
  uchar uStack_7201;
  char cStack_7200;
  char cStack_71ff;
  char cStack_71fe;
  char cStack_71fd;
  char cStack_71fc;
  char cStack_71fb;
  char cStack_71fa;
  uchar uStack_71f9;
  ge25519 local_71f8;
  uchar local_7158 [64];
  batch_heap local_7118;
  
  auVar33 = _DAT_00275920;
  if (num == 0) {
    return 0;
  }
  lVar13 = num - 1;
  auVar32._8_4_ = (int)lVar13;
  auVar32._0_8_ = lVar13;
  auVar32._12_4_ = (int)((ulong)lVar13 >> 0x20);
  uVar6 = 0;
  auVar32 = auVar32 ^ _DAT_00275920;
  auVar34 = _DAT_00275ab0;
  auVar35 = _DAT_00275910;
  do {
    auVar36 = auVar35 ^ auVar33;
    iVar5 = auVar32._4_4_;
    if ((bool)(~(auVar36._4_4_ == iVar5 && auVar32._0_4_ < auVar36._0_4_ || iVar5 < auVar36._4_4_) &
              1)) {
      valid[uVar6] = 1;
    }
    if ((auVar36._12_4_ != auVar32._12_4_ || auVar36._8_4_ <= auVar32._8_4_) &&
        auVar36._12_4_ <= auVar32._12_4_) {
      valid[uVar6 + 1] = 1;
    }
    auVar36 = auVar34 ^ auVar33;
    iVar37 = auVar36._4_4_;
    if (iVar37 <= iVar5 && (iVar37 != iVar5 || auVar36._0_4_ <= auVar32._0_4_)) {
      valid[uVar6 + 2] = 1;
      valid[uVar6 + 3] = 1;
    }
    uVar6 = uVar6 + 4;
    lVar13 = auVar35._8_8_;
    auVar35._0_8_ = auVar35._0_8_ + 4;
    auVar35._8_8_ = lVar13 + 4;
    lVar13 = auVar34._8_8_;
    auVar34._0_8_ = auVar34._0_8_ + 4;
    auVar34._8_8_ = lVar13 + 4;
  } while ((num + 3 & 0xfffffffffffffffc) != uVar6);
  uVar30 = 0;
  if (3 < num) {
    uVar30 = 0;
    local_72a0 = pk;
LAB_0021e796:
    buf = &local_7118;
    uVar6 = 0x40;
    if (num < 0x40) {
      uVar6 = num;
    }
    RAND_bytes((uchar *)buf,(int)uVar6 << 4);
    pabVar17 = local_7118.scalars;
    pabVar28 = pabVar17 + uVar6 + 1;
    uVar12 = uVar6;
    out = pabVar28;
    do {
      expand256_modm(*out,(uchar *)buf,0x10);
      buf = (batch_heap *)(buf->r + 1);
      out = out + 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    uVar12 = 0;
    do {
      expand256_modm(*pabVar17,RS[uVar12] + 0x20,0x20);
      mul256_modm(*pabVar17,*pabVar17,*pabVar28);
      uVar12 = uVar12 + 1;
      pabVar28 = pabVar28 + 1;
      pabVar17 = pabVar17 + 1;
    } while (uVar6 != uVar12);
    if (1 < num) {
      lVar13 = uVar6 - 1;
      pabVar28 = local_7118.scalars;
      do {
        pabVar28 = pabVar28 + 1;
        add256_modm(local_7118.scalars[0],local_7118.scalars[0],*pabVar28);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pabVar28 = local_7118.scalars;
    uVar12 = 0;
    do {
      pabVar28 = pabVar28 + 1;
      ed25519_hram(local_7158,RS[uVar12],local_72a0[uVar12],m[uVar12],mlen[uVar12]);
      uVar12 = uVar12 + 1;
      expand256_modm(*pabVar28,local_7158,0x40);
      mul256_modm(*pabVar28,*pabVar28,pabVar28[uVar6]);
    } while (uVar6 != uVar12);
    memcpy(local_7118.points,&ge25519_basepoint,0xa0);
    pgVar29 = local_7118.points;
    uVar12 = 0;
    do {
      pgVar29 = pgVar29 + 1;
      if (uVar6 == uVar12) {
        pgVar29 = local_7118.points + uVar6 + 1;
        uVar12 = 0;
        goto LAB_0021e982;
      }
      ppuVar1 = local_72a0 + uVar12;
      uVar12 = uVar12 + 1;
      iVar5 = ge25519_unpack_negative_vartime(pgVar29,*ppuVar1);
    } while (iVar5 != 0);
    goto LAB_0021f539;
  }
LAB_0021f5e1:
  sVar16 = 0;
  do {
    iVar5 = ed25519_sign_open(m[sVar16],mlen[sVar16],pk[sVar16],RS[sVar16]);
    valid[sVar16] = (uint)(iVar5 == 0);
    uVar30 = uVar30 | iVar5 == 0 ^ 1;
    sVar16 = sVar16 + 1;
  } while (num != sVar16);
  return uVar30;
  while( true ) {
    uVar12 = uVar12 + 1;
    pgVar29 = pgVar29 + 1;
    if (uVar6 == uVar12) break;
LAB_0021e982:
    iVar5 = ge25519_unpack_negative_vartime(pgVar29,RS[uVar12]);
    if (iVar5 == 0) goto LAB_0021f539;
  }
  local_7118.heap[0] = 0;
  local_7118.size = 0;
  do {
    heap_insert_next(&local_7118);
  } while (local_7118.size < (uVar6 + 1 | 1));
  bVar2 = false;
  local_72b0 = 4;
LAB_0021e9ef:
  hVar26 = local_7118.heap[2];
  hVar18 = local_7118.heap[1];
  hVar14 = local_7118.heap[0];
  iVar5 = lt256_modm_batch(local_7118.scalars[local_7118.heap[1]],
                           local_7118.scalars[local_7118.heap[2]],local_72b0);
  hVar7 = hVar26;
  if (iVar5 == 0) {
    hVar7 = hVar18;
  }
  lVar13 = 0;
  while (local_7118.scalars[hVar7][lVar13] == 0) {
    lVar13 = lVar13 + 1;
    if (lVar13 == 5) {
      pgVar29 = local_7118.points + hVar14;
      lVar13 = 0;
      goto LAB_0021ee14;
    }
  }
  local_72b0 = local_72b0 - (local_7118.scalars[hVar14][local_72b0] == 0);
  bVar4 = true;
  bVar3 = !bVar2;
  bVar2 = bVar4;
  if (bVar3) {
    if ((local_7118.scalars[hVar14][2] & 0xffffffffff0000) == 0 &&
        (local_7118.scalars[hVar14][3] == 0 && local_7118.scalars[hVar14][4] == 0)) {
      if (local_7118.size <= uVar6 * 2) {
        do {
          heap_insert_next(&local_7118);
          hVar14 = local_7118.heap[0];
          hVar18 = local_7118.heap[1];
          hVar26 = local_7118.heap[2];
        } while (local_7118.size <= uVar6 * 2);
      }
      iVar5 = lt256_modm_batch(local_7118.scalars[hVar18],local_7118.scalars[hVar26],local_72b0);
      hVar7 = hVar26;
      if (iVar5 == 0) {
        hVar7 = hVar18;
      }
    }
    else {
      bVar2 = false;
    }
  }
  pabVar28 = local_7118.scalars + hVar14;
  pabVar17 = local_7118.scalars + hVar7;
  iVar37 = 0;
  lVar19 = 0;
  iVar22 = 0;
  lVar25 = 0;
  iVar5 = 0;
  lVar13 = 0;
  switch(local_72b0) {
  case 4:
    uVar12 = (*pabVar28)[0] - (*pabVar17)[0];
    lVar19 = (long)uVar12 >> 0x3f;
    (*pabVar28)[0] = uVar12 & 0xffffffffffffff;
    iVar37 = 1;
  case 3:
    uVar12 = (ulong)(uint)(iVar37 * 8);
    uVar8 = (*(long *)((long)*pabVar28 + uVar12) - *(long *)((long)*pabVar17 + uVar12)) + lVar19;
    lVar25 = (long)uVar8 >> 0x3f;
    *(ulong *)((long)*pabVar28 + uVar12) = uVar8 & 0xffffffffffffff;
    iVar22 = iVar37 + 1;
  case 2:
    uVar12 = (ulong)(uint)(iVar22 * 8);
    uVar8 = (*(long *)((long)*pabVar28 + uVar12) - *(long *)((long)*pabVar17 + uVar12)) + lVar25;
    lVar13 = (long)uVar8 >> 0x3f;
    *(ulong *)((long)*pabVar28 + uVar12) = uVar8 & 0xffffffffffffff;
    iVar5 = iVar22 + 1;
  case 1:
    uVar12 = (ulong)(uint)(iVar5 * 8);
    uVar8 = (*(long *)((long)*pabVar28 + uVar12) - *(long *)((long)*pabVar17 + uVar12)) + lVar13;
    lVar13 = (long)uVar8 >> 0x3f;
    *(ulong *)((long)*pabVar28 + uVar12) = uVar8 & 0xffffffffffffff;
    iVar5 = iVar5 + 1;
    break;
  default:
    iVar5 = 0;
    lVar13 = 0;
  }
  uVar12 = (ulong)(uint)(iVar5 << 3);
  *(long *)((long)*pabVar28 + uVar12) =
       (lVar13 + *(long *)((long)*pabVar28 + uVar12)) - *(long *)((long)*pabVar17 + uVar12);
  ge25519_add(local_7118.points + hVar7,local_7118.points + hVar7,local_7118.points + hVar14);
  hVar14 = local_7118.heap[0];
  uVar12 = 1;
  if (2 < local_7118.size) goto code_r0x0021ec3c;
  goto LAB_0021ecc8;
  while (lVar13 = lVar13 + 1, lVar13 != 5) {
LAB_0021ee14:
    if (local_7118.scalars[hVar14][lVar13] != (ulong)(lVar13 == 0)) {
      lVar13 = 0;
      goto LAB_0021ee42;
    }
  }
  memcpy(&local_71f8,pgVar29,0xa0);
LAB_0021ef05:
  uVar12 = (local_71f8.x[0] >> 0x33) + local_71f8.x[1];
  uVar8 = (uVar12 >> 0x33) + local_71f8.x[2];
  uVar9 = (uVar8 >> 0x33) + local_71f8.x[3];
  uVar20 = (uVar9 >> 0x33) + local_71f8.x[4];
  uVar21 = (uVar20 >> 0x33) * 0x13 + (local_71f8.x[0] & 0x7ffffffffffff);
  uVar23 = (uVar21 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar12 = (uVar23 >> 0x33) + (uVar8 & 0x7ffffffffffff);
  uVar24 = (uVar12 >> 0x33) + (uVar9 & 0x7ffffffffffff);
  uVar9 = (uVar24 >> 0x33) + (uVar20 & 0x7ffffffffffff);
  uVar20 = (uVar21 & 0x7ffffffffffff) + (uVar9 >> 0x33) * 0x13 + 0x13;
  uVar8 = (uVar20 >> 0x33) + (uVar23 & 0x7ffffffffffff);
  uVar21 = (uVar8 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar23 = (uVar21 >> 0x33) + (uVar24 & 0x7ffffffffffff);
  uVar12 = (uVar23 >> 0x33) + (uVar9 & 0x7ffffffffffff);
  uVar24 = (uVar20 & 0x7ffffffffffff) + (uVar12 >> 0x33) * 0x13 + 0x7ffffffffffed;
  uVar9 = (uVar24 >> 0x33) + (uVar8 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar20 = (uVar9 >> 0x33) + (uVar21 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar8 = (uVar20 >> 0x33) + (uVar23 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar21 = uVar9 << 0x33 | uVar24 & 0x7ffffffffffff;
  lVar13 = 0;
  do {
    *(char *)((long)&local_7258 + lVar13) = (char)uVar21;
    lVar13 = lVar13 + 1;
    uVar21 = uVar21 >> 8;
  } while (lVar13 != 8);
  uVar9 = uVar20 << 0x26 | uVar9 >> 0xd & 0x3fffffffff;
  lVar13 = 8;
  do {
    *(char *)((long)&local_7258 + lVar13) = (char)uVar9;
    lVar13 = lVar13 + 1;
    uVar9 = uVar9 >> 8;
  } while (lVar13 != 0x10);
  plVar10 = &local_7248;
  uVar9 = uVar8 * 0x2000000 | (ulong)((uint)(uVar20 >> 0x1a) & 0x1ffffff);
  lVar13 = 8;
  do {
    *(char *)plVar10 = (char)uVar9;
    plVar10 = (long *)((long)plVar10 + 1);
    uVar9 = uVar9 >> 8;
    lVar13 = lVar13 + -1;
  } while (lVar13 != 0);
  uVar12 = (uVar12 + 0x7ffffffffffff + (uVar8 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
           (ulong)((uint)(uVar8 >> 0x27) & 0xfff);
  lVar13 = 8;
  do {
    *(char *)plVar10 = (char)uVar12;
    plVar10 = (long *)((long)plVar10 + 1);
    uVar12 = uVar12 >> 8;
    lVar13 = lVar13 + -1;
  } while (lVar13 != 0);
  uVar12 = (local_71f8.y[0] >> 0x33) + local_71f8.y[1];
  uVar8 = (uVar12 >> 0x33) + local_71f8.y[2];
  uVar9 = (uVar8 >> 0x33) + local_71f8.y[3];
  uVar20 = (uVar9 >> 0x33) + local_71f8.y[4];
  uVar21 = (uVar20 >> 0x33) * 0x13 + (local_71f8.y[0] & 0x7ffffffffffff);
  uVar23 = (uVar21 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar12 = (uVar23 >> 0x33) + (uVar8 & 0x7ffffffffffff);
  uVar24 = (uVar12 >> 0x33) + (uVar9 & 0x7ffffffffffff);
  uVar9 = (uVar24 >> 0x33) + (uVar20 & 0x7ffffffffffff);
  uVar20 = (uVar21 & 0x7ffffffffffff) + (uVar9 >> 0x33) * 0x13 + 0x13;
  uVar8 = (uVar20 >> 0x33) + (uVar23 & 0x7ffffffffffff);
  uVar21 = (uVar8 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar23 = (uVar21 >> 0x33) + (uVar24 & 0x7ffffffffffff);
  uVar12 = (uVar23 >> 0x33) + (uVar9 & 0x7ffffffffffff);
  uVar24 = (uVar20 & 0x7ffffffffffff) + (uVar12 >> 0x33) * 0x13 + 0x7ffffffffffed;
  uVar9 = (uVar24 >> 0x33) + (uVar8 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar20 = (uVar9 >> 0x33) + (uVar21 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar8 = (uVar20 >> 0x33) + (uVar23 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar21 = uVar9 << 0x33 | uVar24 & 0x7ffffffffffff;
  lVar13 = 0x20;
  do {
    *(char *)((long)&local_7258 + lVar13) = (char)uVar21;
    lVar13 = lVar13 + 1;
    uVar21 = uVar21 >> 8;
  } while (lVar13 != 0x28);
  uVar9 = uVar20 << 0x26 | uVar9 >> 0xd & 0x3fffffffff;
  lVar13 = 0x28;
  do {
    *(char *)((long)&local_7258 + lVar13) = (char)uVar9;
    lVar13 = lVar13 + 1;
    uVar9 = uVar9 >> 8;
  } while (lVar13 != 0x30);
  pcVar11 = local_7228;
  uVar9 = uVar8 * 0x2000000 | (ulong)((uint)(uVar20 >> 0x1a) & 0x1ffffff);
  lVar13 = 8;
  do {
    *pcVar11 = (char)uVar9;
    pcVar11 = pcVar11 + 1;
    uVar9 = uVar9 >> 8;
    lVar13 = lVar13 + -1;
  } while (lVar13 != 0);
  uVar12 = (uVar12 + 0x7ffffffffffff + (uVar8 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
           (ulong)((uint)(uVar8 >> 0x27) & 0xfff);
  lVar13 = 8;
  do {
    *pcVar11 = (char)uVar12;
    pcVar11 = pcVar11 + 1;
    uVar12 = uVar12 >> 8;
    lVar13 = lVar13 + -1;
  } while (lVar13 != 0);
  uVar12 = (local_71f8.z[0] >> 0x33) + local_71f8.z[1];
  uVar8 = (uVar12 >> 0x33) + local_71f8.z[2];
  uVar9 = (uVar8 >> 0x33) + local_71f8.z[3];
  uVar20 = (uVar9 >> 0x33) + local_71f8.z[4];
  uVar21 = (uVar20 >> 0x33) * 0x13 + (local_71f8.z[0] & 0x7ffffffffffff);
  uVar23 = (uVar21 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar12 = (uVar23 >> 0x33) + (uVar8 & 0x7ffffffffffff);
  uVar24 = (uVar12 >> 0x33) + (uVar9 & 0x7ffffffffffff);
  uVar9 = (uVar24 >> 0x33) + (uVar20 & 0x7ffffffffffff);
  uVar20 = (uVar21 & 0x7ffffffffffff) + (uVar9 >> 0x33) * 0x13 + 0x13;
  uVar8 = (uVar20 >> 0x33) + (uVar23 & 0x7ffffffffffff);
  uVar21 = (uVar8 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar23 = (uVar21 >> 0x33) + (uVar24 & 0x7ffffffffffff);
  uVar12 = (uVar23 >> 0x33) + (uVar9 & 0x7ffffffffffff);
  uVar24 = (uVar20 & 0x7ffffffffffff) + (uVar12 >> 0x33) * 0x13 + 0x7ffffffffffed;
  uVar9 = (uVar24 >> 0x33) + (uVar8 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar20 = (uVar9 >> 0x33) + (uVar21 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar8 = (uVar20 >> 0x33) + (uVar23 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar21 = uVar9 << 0x33 | uVar24 & 0x7ffffffffffff;
  lVar13 = 0x40;
  do {
    *(char *)((long)&local_7258 + lVar13) = (char)uVar21;
    lVar13 = lVar13 + 1;
    uVar21 = uVar21 >> 8;
  } while (lVar13 != 0x48);
  uVar9 = uVar20 << 0x26 | uVar9 >> 0xd & 0x3fffffffff;
  lVar13 = 0x48;
  do {
    *(char *)((long)&local_7258 + lVar13) = (char)uVar9;
    lVar13 = lVar13 + 1;
    uVar9 = uVar9 >> 8;
  } while (lVar13 != 0x50);
  pcVar11 = local_7208;
  uVar9 = uVar8 * 0x2000000 | (ulong)((uint)(uVar20 >> 0x1a) & 0x1ffffff);
  lVar13 = 8;
  do {
    *pcVar11 = (char)uVar9;
    pcVar11 = pcVar11 + 1;
    uVar9 = uVar9 >> 8;
    lVar13 = lVar13 + -1;
  } while (lVar13 != 0);
  uVar12 = (uVar12 + 0x7ffffffffffff + (uVar8 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
           (ulong)((uint)(uVar8 >> 0x27) & 0xfff);
  lVar13 = 8;
  do {
    *pcVar11 = (char)uVar12;
    pcVar11 = pcVar11 + 1;
    uVar12 = uVar12 >> 8;
    lVar13 = lVar13 + -1;
  } while (lVar13 != 0);
  batch_point_buffer[1][1] = local_7238[1];
  batch_point_buffer[1][0] = local_7238[0];
  batch_point_buffer[1][2] = local_7238[2];
  batch_point_buffer[1][3] = local_7238[3];
  batch_point_buffer[1][4] = local_7238[4];
  batch_point_buffer[1][5] = local_7238[5];
  batch_point_buffer[1][6] = local_7238[6];
  batch_point_buffer[1][7] = local_7238[7];
  batch_point_buffer[1][9] = acStack_7230[1];
  batch_point_buffer[1][8] = acStack_7230[0];
  batch_point_buffer[1][10] = acStack_7230[2];
  batch_point_buffer[1][0xb] = acStack_7230[3];
  batch_point_buffer[1][0xc] = acStack_7230[4];
  batch_point_buffer[1][0xd] = acStack_7230[5];
  batch_point_buffer[1][0xe] = acStack_7230[6];
  batch_point_buffer[1][0xf] = acStack_7230[7];
  batch_point_buffer[1][0x11] = local_7228[1];
  batch_point_buffer[1][0x10] = local_7228[0];
  batch_point_buffer[1][0x12] = local_7228[2];
  batch_point_buffer[1][0x13] = local_7228[3];
  batch_point_buffer[1][0x14] = cStack_7224;
  batch_point_buffer[1][0x15] = cStack_7223;
  batch_point_buffer[1][0x16] = cStack_7222;
  batch_point_buffer[1][0x17] = uStack_7221;
  batch_point_buffer[1][0x19] = cStack_721f;
  batch_point_buffer[1][0x18] = cStack_7220;
  batch_point_buffer[1][0x1a] = cStack_721e;
  batch_point_buffer[1][0x1b] = cStack_721d;
  batch_point_buffer[1][0x1c] = cStack_721c;
  batch_point_buffer[1][0x1d] = cStack_721b;
  batch_point_buffer[1][0x1e] = cStack_721a;
  batch_point_buffer[1][0x1f] = uStack_7219;
  if (((local_7258 != 0 || local_7248 != 0) || (local_7250 != 0 || local_7240 != 0)) ||
     (auVar36[0] = -(local_7228[0] == local_7208[0]), auVar36[1] = -(local_7228[1] == local_7208[1])
     , auVar36[2] = -(local_7228[2] == local_7208[2]),
     auVar36[3] = -(local_7228[3] == local_7208[3]), auVar36[4] = -(cStack_7224 == cStack_7204),
     auVar36[5] = -(cStack_7223 == cStack_7203), auVar36[6] = -(cStack_7222 == cStack_7202),
     auVar36[7] = -(uStack_7221 == uStack_7201), auVar36[8] = -(cStack_7220 == cStack_7200),
     auVar36[9] = -(cStack_721f == cStack_71ff), auVar36[10] = -(cStack_721e == cStack_71fe),
     auVar36[0xb] = -(cStack_721d == cStack_71fd), auVar36[0xc] = -(cStack_721c == cStack_71fc),
     auVar36[0xd] = -(cStack_721b == cStack_71fb), auVar36[0xe] = -(cStack_721a == cStack_71fa),
     auVar36[0xf] = -(uStack_7219 == uStack_71f9), auVar33[0] = -(local_7238[0] == local_7218[0]),
     auVar33[1] = -(local_7238[1] == local_7218[1]), auVar33[2] = -(local_7238[2] == local_7218[2]),
     auVar33[3] = -(local_7238[3] == local_7218[3]), auVar33[4] = -(local_7238[4] == local_7218[4]),
     auVar33[5] = -(local_7238[5] == local_7218[5]), auVar33[6] = -(local_7238[6] == local_7218[6]),
     auVar33[7] = -(local_7238[7] == local_7218[7]),
     auVar33[8] = -(acStack_7230[0] == acStack_7210[0]),
     auVar33[9] = -(acStack_7230[1] == acStack_7210[1]),
     auVar33[10] = -(acStack_7230[2] == acStack_7210[2]),
     auVar33[0xb] = -(acStack_7230[3] == acStack_7210[3]),
     auVar33[0xc] = -(acStack_7230[4] == acStack_7210[4]),
     auVar33[0xd] = -(acStack_7230[5] == acStack_7210[5]),
     auVar33[0xe] = -(acStack_7230[6] == acStack_7210[6]),
     auVar33[0xf] = -(acStack_7230[7] == acStack_7210[7]), auVar33 = auVar33 & auVar36,
     (ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) != 0xffff)) {
    uVar30 = uVar30 | 2;
LAB_0021f539:
    uVar12 = 0;
    do {
      iVar5 = ed25519_sign_open(m[uVar12],mlen[uVar12],local_72a0[uVar12],RS[uVar12]);
      valid[uVar12] = (uint)(iVar5 == 0);
      uVar30 = uVar30 | iVar5 == 0 ^ 1;
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  m = m + uVar6;
  mlen = mlen + uVar6;
  pk = local_72a0 + uVar6;
  RS = RS + uVar6;
  num = num - uVar6;
  valid = valid + uVar6;
  local_72a0 = pk;
  if (num < 4) goto LAB_0021f5d7;
  goto LAB_0021e796;
LAB_0021ee42:
  if (local_7118.scalars[hVar14][lVar13] == 0) goto code_r0x0021ee49;
  memcpy(&local_71f8,pgVar29,0xa0);
  lVar13 = 0xb19;
  do {
    lVar19 = lVar13;
    bVar27 = *(ulong *)((long)local_7118.r + lVar19 * 8 + hVar14 * 0x28);
    lVar13 = lVar19 + -1;
  } while (bVar27 == 0);
  lVar19 = lVar19 + -0xb16;
  uVar12 = 0x80000000000000;
  do {
    uVar8 = uVar12;
    uVar12 = uVar8 >> 1;
  } while ((uVar8 & bVar27) == 0);
  while( true ) {
    do {
      ge25519_double(&local_71f8,&local_71f8);
      if ((bVar27 & uVar8) != 0) {
        ge25519_add(&local_71f8,&local_71f8,pgVar29);
      }
      bVar2 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
    } while (bVar2);
    if (lVar19 == 0) break;
    bVar27 = local_7118.scalars[hVar14 - 1][lVar19 + 4];
    uVar8 = 0x80000000000000;
    lVar19 = lVar19 + -1;
  }
  goto LAB_0021ef05;
code_r0x0021ee49:
  lVar13 = lVar13 + 1;
  if (lVar13 == 5) goto code_r0x0021ee52;
  goto LAB_0021ee42;
code_r0x0021ee52:
  memset(&local_71f8,0,0xa0);
  local_71f8.y[0] = 1;
  local_71f8.z[0] = 1;
  goto LAB_0021ef05;
code_r0x0021ec3c:
  uVar9 = 2;
  uVar8 = 1;
  uVar20 = 0;
  do {
    iVar5 = lt256_modm_batch(local_7118.scalars[local_7118.heap[uVar8]],
                             local_7118.scalars[local_7118.heap[uVar9]],local_72b0);
    uVar12 = uVar8;
    if (iVar5 != 0) {
      uVar12 = uVar9;
    }
    local_7118.heap[uVar20] = local_7118.heap[uVar12];
    local_7118.heap[uVar12] = hVar14;
    uVar8 = uVar12 * 2 + 1;
    uVar9 = uVar12 * 2 + 2;
    uVar20 = uVar12;
  } while (uVar9 < local_7118.size);
  if (uVar12 != 0) {
LAB_0021ecc8:
    do {
      uVar8 = uVar12 - 1;
      uVar9 = uVar8 >> 1;
      hVar14 = local_7118.heap[uVar9];
      if (local_72b0 < 5) {
        pabVar28 = local_7118.scalars + hVar14;
        pabVar17 = local_7118.scalars + local_7118.heap[uVar12];
        lVar31 = 0;
        lVar13 = 0;
        lVar25 = 0;
        lVar19 = 0;
        sVar16 = local_72b0;
        sVar15 = local_72b0;
        switch(local_72b0) {
        case 4:
          lVar13 = (long)((*pabVar17)[0] - (*pabVar28)[0]) >> 0x3f;
          lVar31 = 1;
        case 3:
          uVar20 = (ulong)(uint)((int)lVar31 * 8);
          lVar19 = (lVar13 + *(long *)((long)*pabVar17 + uVar20)) -
                   *(long *)((long)*pabVar28 + uVar20) >> 0x3f;
          lVar25 = lVar31 + 1;
        case 2:
          uVar20 = (ulong)(uint)((int)lVar25 * 8);
          lVar19 = (lVar19 + *(long *)((long)*pabVar17 + uVar20)) -
                   *(long *)((long)*pabVar28 + uVar20) >> 0x3f;
          lVar25 = lVar25 + 1;
        case 1:
          uVar20 = (ulong)(uint)((int)lVar25 * 8);
          sVar16 = (lVar19 + *(long *)((long)*pabVar17 + uVar20)) -
                   *(long *)((long)*pabVar28 + uVar20) >> 0x3f;
          sVar15 = lVar25 + 1;
        }
        if ((long)((sVar16 + (*pabVar17)[sVar15]) - (*pabVar28)[sVar15]) < 0) break;
      }
      local_7118.heap[uVar9] = local_7118.heap[uVar12];
      local_7118.heap[uVar12] = hVar14;
      uVar12 = uVar9;
    } while (1 < uVar8);
  }
  goto LAB_0021e9ef;
LAB_0021f5d7:
  if (num == 0) {
    return uVar30;
  }
  goto LAB_0021f5e1;
}

Assistant:

int
ED25519_FN(ed25519_sign_open_batch) (const unsigned char **m, size_t *mlen, const unsigned char **pk, const unsigned char **RS, size_t num, int *valid) {
	batch_heap ALIGN(16) batch;
	ge25519 ALIGN(16) p;
	bignum256modm *r_scalars;
	size_t i, batchsize;
	unsigned char hram[64];
	int ret = 0;

	for (i = 0; i < num; i++)
		valid[i] = 1;

	while (num > 3) {
		batchsize = (num > max_batch_size) ? max_batch_size : num;

		/* generate r (scalars[batchsize+1]..scalars[2*batchsize] */
		ED25519_FN(ed25519_randombytes_unsafe) (batch.r, batchsize * 16);
		r_scalars = &batch.scalars[batchsize + 1];
		for (i = 0; i < batchsize; i++)
			expand256_modm(r_scalars[i], batch.r[i], 16);

		/* compute scalars[0] = ((r1s1 + r2s2 + ...)) */
		for (i = 0; i < batchsize; i++) {
			expand256_modm(batch.scalars[i], RS[i] + 32, 32);
			mul256_modm(batch.scalars[i], batch.scalars[i], r_scalars[i]);
		}
		for (i = 1; i < batchsize; i++)
			add256_modm(batch.scalars[0], batch.scalars[0], batch.scalars[i]);

		/* compute scalars[1]..scalars[batchsize] as r[i]*H(R[i],A[i],m[i]) */
		for (i = 0; i < batchsize; i++) {
			ed25519_hram(hram, RS[i], pk[i], m[i], mlen[i]);
			expand256_modm(batch.scalars[i+1], hram, 64);
			mul256_modm(batch.scalars[i+1], batch.scalars[i+1], r_scalars[i]);
		}

		/* compute points */
		batch.points[0] = ge25519_basepoint;
		for (i = 0; i < batchsize; i++)
			if (!ge25519_unpack_negative_vartime(&batch.points[i+1], pk[i]))
				goto fallback;
		for (i = 0; i < batchsize; i++)
			if (!ge25519_unpack_negative_vartime(&batch.points[batchsize+i+1], RS[i]))
				goto fallback;

		ge25519_multi_scalarmult_vartime(&p, &batch, (batchsize * 2) + 1);
		if (!ge25519_is_neutral_vartime(&p)) {
			ret |= 2;

			fallback:
			for (i = 0; i < batchsize; i++) {
				valid[i] = ED25519_FN(ed25519_sign_open) (m[i], mlen[i], pk[i], RS[i]) ? 0 : 1;
				ret |= (valid[i] ^ 1);
			}
		}

		m += batchsize;
		mlen += batchsize;
		pk += batchsize;
		RS += batchsize;
		num -= batchsize;
		valid += batchsize;
	}

	for (i = 0; i < num; i++) {
		valid[i] = ED25519_FN(ed25519_sign_open) (m[i], mlen[i], pk[i], RS[i]) ? 0 : 1;
		ret |= (valid[i] ^ 1);
	}

	return ret;
}